

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Zuker.cpp
# Opt level: O3

void __thiscall Zuker::get_rna_cai(Zuker *this,string *rna)

{
  int (*paiVar1) [3];
  pointer piVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int (*paiVar6) [3];
  pointer pcVar7;
  long lVar8;
  long lVar9;
  int index;
  long lVar10;
  long lVar11;
  long lVar12;
  
  if (0 < this->n) {
    index = 0;
    do {
      lVar12 = (long)index;
      piVar2 = (this->nucle_seq).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar8 = (long)piVar2[lVar12];
      if (lVar8 == -1) {
        if (index * -0x55555555 + 0x2aaaaaaaU < 0x55555555) {
          lVar10 = (long)index;
          iVar4 = index / 3;
          lVar8 = lVar10 + 1;
          lVar11 = (long)piVar2[lVar10 + 1];
          lVar9 = lVar10 + 2;
          iVar5 = piVar2[lVar10 + 2];
          if (lVar11 == -1) {
            if (iVar5 == -1) {
              iVar5 = (this->protein).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar4];
              iVar4 = (this->codon_selection).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar4];
              if (iVar4 == -1) {
                iVar4 = max_cai_pos[iVar5];
              }
              paiVar1 = nucleotides[iVar5] + iVar4;
              paiVar6 = (int (*) [3])(*paiVar1 + 2);
              (rna->_M_dataplus)._M_p[lVar12] =
                   to_char.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start[(*paiVar1)[0]];
              (rna->_M_dataplus)._M_p[lVar8] =
                   to_char.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start[(*paiVar1)[1]];
            }
            else {
              iVar3 = (this->codon_selection).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar4];
              if (iVar3 == -1) {
                iVar3 = fill_rna(this,index);
              }
              (rna->_M_dataplus)._M_p[lVar9] =
                   to_char.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar5];
              (rna->_M_dataplus)._M_p[lVar12] =
                   to_char.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start
                   [nucleotides
                    [(this->protein).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar4]][iVar3][0]];
              paiVar6 = (int (*) [3])
                        (nucleotides
                         [(this->protein).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[iVar4]][iVar3] + 1);
              lVar9 = lVar8;
            }
          }
          else {
            iVar3 = (this->codon_selection).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar4];
            if (iVar5 == -1) {
              if (iVar3 == -1) {
                iVar3 = fill_rna(this,index);
              }
              (rna->_M_dataplus)._M_p[lVar8] =
                   to_char.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar11];
              (rna->_M_dataplus)._M_p[lVar12] =
                   to_char.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start
                   [nucleotides
                    [(this->protein).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar4]][iVar3][0]];
              paiVar6 = (int (*) [3])
                        (nucleotides
                         [(this->protein).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[iVar4]][iVar3] + 2);
            }
            else {
              if (iVar3 == -1) {
                iVar3 = fill_rna(this,index);
              }
              (rna->_M_dataplus)._M_p[lVar8] =
                   to_char.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar11];
              (rna->_M_dataplus)._M_p[lVar10 + 2] =
                   to_char.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start
                   [(this->nucle_seq).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar10 + 2]];
              paiVar6 = nucleotides
                        [(this->protein).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar4]] + iVar3;
              lVar9 = lVar12;
            }
          }
          (rna->_M_dataplus)._M_p[lVar9] =
               to_char.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start[(*paiVar6)[0]];
          index = index + 3;
        }
        lVar8 = (long)index;
        iVar5 = index / 3;
        if (index % 3 == 1) {
          lVar12 = lVar8 + 1;
          lVar9 = (long)(this->nucle_seq).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar8 + 1];
          iVar4 = (this->codon_selection).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar5];
          if (lVar9 == -1) {
            if (iVar4 == -1) {
              iVar4 = fill_rna(this,index);
            }
            (rna->_M_dataplus)._M_p[index] =
                 to_char.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start
                 [*(int *)((long)(this->protein).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start[iVar5] * 0x48 + 0x1b20a4 +
                          (long)iVar4 * 0xc)];
            pcVar7 = to_char.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start +
                     *(int *)((long)(this->protein).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start[iVar5] * 0x48 +
                              0x1b20a8 + (long)iVar4 * 0xc);
          }
          else {
            if (iVar4 == -1) {
              iVar4 = fill_rna(this,index);
            }
            (rna->_M_dataplus)._M_p[lVar12] =
                 to_char.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar9];
            pcVar7 = to_char.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start +
                     *(int *)((long)(this->protein).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start[iVar5] * 0x48 +
                              0x1b20a4 + (long)iVar4 * 0xc);
            lVar12 = lVar8;
          }
          (rna->_M_dataplus)._M_p[lVar12] = *pcVar7;
          index = index + 2;
        }
        lVar12 = (long)index;
        if (index % 3 == 2) {
          iVar5 = (this->codon_selection).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[index / 3];
          if (iVar5 == -1) {
            iVar5 = fill_rna(this,index);
          }
          lVar8 = (long)*(int *)((long)(this->protein).super__Vector_base<int,_std::allocator<int>_>
                                       ._M_impl.super__Vector_impl_data._M_start[index / 3] * 0x48 +
                                 0x1b20a8 + (long)iVar5 * 0xc);
          goto LAB_00137b7a;
        }
      }
      else {
LAB_00137b7a:
        (rna->_M_dataplus)._M_p[lVar12] =
             to_char.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
             ._M_start[lVar8];
        index = index + 1;
      }
    } while (SBORROW4(index,this->n * 3) != index + this->n * -3 < 0);
  }
  return;
}

Assistant:

void Zuker::get_rna_cai(string & rna) {


    int i = 0;
    while (i < 3*n) {
        if (nucle_seq[i] == -1) {
            if (i % 3 == 0) {
                if (nucle_seq[i+1] == -1 && nucle_seq[i+2] == -1) {
                    int p = protein[i/3];
                    int x = codon_selection[i/3];

                    if (x == -1)
                        x = max_cai_pos[p];
                    rna[i] = to_char[nucleotides[p][x][0]];
                    rna[i+1] = to_char[nucleotides[p][x][1]];
                    rna[i+2] = to_char[nucleotides[p][x][2]];
                    i = i+3;
                }
                else if (nucle_seq[i+1] == -1) {

                    int idx = codon_selection[i/3];
                    if (idx == -1)
                        idx = fill_rna(i);
                    rna[i+2] = to_char[nucle_seq[i+2]];
                    rna[i] = to_char[nucleotides[protein[i/3]][idx][0]];
                    rna[i+1] = to_char[nucleotides[protein[i/3]][idx][1]];

                    i = i+3;
                }
                else if (nucle_seq[i+2] == -1) {
                    int idx = codon_selection[i/3];
                    if (idx == -1)
                        idx = fill_rna(i);
                    rna[i+1] = to_char[nucle_seq[i+1]];
                    rna[i] = to_char[nucleotides[protein[i/3]][idx][0]];
                    rna[i+2] = to_char[nucleotides[protein[i/3]][idx][2]];

                    i = i+3;
                }
                else {
                    int idx = codon_selection[i/3];
                    if (idx == -1)
                        idx = fill_rna(i);
                    rna[i+1] = to_char[nucle_seq[i+1]];
                    rna[i+2] = to_char[nucle_seq[i+2]];
                    rna[i] = to_char[nucleotides[protein[i/3]][idx][0]];

                    i = i+3;
                }
            }
            if (i % 3 == 1) {
                if (nucle_seq[i+1] == -1) {

                    int idx = codon_selection[i/3];
                    if (idx == -1)
                        idx = fill_rna(i);
                    rna[i] = to_char[nucleotides[protein[i/3]][idx][1]];
                    rna[i+1] = to_char[nucleotides[protein[i/3]][idx][2]];


                    i = i+2;
                } else {
                    int idx = codon_selection[i/3];
                    if (idx == -1)
                        idx = fill_rna(i);
                    rna[i+1] = to_char[nucle_seq[i+1]];
                    rna[i] = to_char[nucleotides[protein[i/3]][idx][1]];

                    i = i+2;
                }
            }
            if (i % 3 == 2) {

                int idx = codon_selection[i/3];
                if (idx == -1)
                    idx = fill_rna(i);
                rna[i] = to_char[nucleotides[protein[i/3]][idx][2]];

                i++;
            }
        }
        else {
            rna[i] = to_char[nucle_seq[i]];
            i++;
        }
    }
}